

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
genShaderSourceTextureLod_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          ShaderType shaderType,DataType samplerDataType,DataType pDataType,DataType lodDataType)

{
  bool bVar1;
  ContextType ctxType;
  char *pcVar2;
  ostream *poVar3;
  ShaderType shaderType_00;
  DataType dataType;
  allocator<char> local_2cf;
  allocator<char> local_2ce;
  allocator<char> local_2cd;
  DataType local_2cc;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  ostringstream source;
  
  shaderType_00 = shaderType;
  local_2cc = pDataType;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
  ctxType.super_ApiType.m_bits = (ApiType)(**(code **)(**(long **)(this + 0x20) + 0x10))();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  pcVar2 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  poVar3 = std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  getDataTypeExtension_abi_cxx11_(&local_1e8,(_anonymous_namespace_ *)(ulong)shaderType,dataType);
  NegativeTestShared::anon_unknown_0::getShaderExtensionDeclaration(&local_1c8,&local_1e8);
  poVar3 = std::operator<<(poVar3,(string *)&local_1c8);
  getShaderInitialization_abi_cxx11_
            (&local_208,this,(NegativeTestContext *)((ulong)ctx & 0xffffffff),shaderType_00);
  poVar3 = std::operator<<(poVar3,(string *)&local_208);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"sampler",&local_2cd);
  NegativeTestShared::anon_unknown_0::declareShaderUniform(&local_228,shaderType,&local_248);
  poVar3 = std::operator<<(poVar3,(string *)&local_228);
  poVar3 = std::operator<<(poVar3,"void main(void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    ");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"P",&local_2ce);
  NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
            (&local_268,samplerDataType,&local_288);
  poVar3 = std::operator<<(poVar3,(string *)&local_268);
  poVar3 = std::operator<<(poVar3,"    ");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"lod",&local_2cf);
  NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
            (&local_2a8,local_2cc,&local_2c8);
  poVar3 = std::operator<<(poVar3,(string *)&local_2a8);
  poVar3 = std::operator<<(poVar3,"    textureLod(sampler, P, lod);\n");
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
  return __return_storage_ptr__;
}

Assistant:

std::string genShaderSourceTextureLod (NegativeTestContext& ctx, glu::ShaderType shaderType, glu::DataType samplerDataType, glu::DataType pDataType, glu::DataType lodDataType)
{
	std::ostringstream source;
	source	<< (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) ? glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES)) << "\n"
			<< getShaderExtensionDeclaration(getDataTypeExtension(samplerDataType))
			<< getShaderInitialization(ctx, shaderType)
			<< declareShaderUniform(samplerDataType, "sampler")
			<< "void main(void)\n"
			<< "{\n"
			<< "    " << declareAndInitializeShaderVariable(pDataType, "P")
			<< "    " << declareAndInitializeShaderVariable(lodDataType, "lod")
			<< "    textureLod(sampler, P, lod);\n"
			<< "}\n";

	return source.str();
}